

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLine::SectionParser::SectionParser
          (SectionParser *this,DWARFDataExtractor *Data,DWARFContext *C,cu_range CUs,tu_range TUs)

{
  _Rb_tree_header *p_Var1;
  unsigned_long *puVar2;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1_1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  Optional<unsigned_long> OVar4;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  local_c0;
  pair<unsigned_long,_llvm::DWARFUnit_*> local_90 [3];
  undefined1 local_58 [8];
  DWARFDie CUDIE;
  Optional<unsigned_long> StmtOffset;
  
  p_Var1 = &(this->LineToUnit)._M_t._M_impl.super__Rb_tree_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->DebugLineData = Data;
  this->Context = C;
  this->Offset = 0;
  this->Done = false;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  for (puVar3 = CUs.begin_iterator; puVar3 != CUs.end_iterator; puVar3 = puVar3 + 1) {
    _local_58 = DWARFUnit::getUnitDIE
                          ((puVar3->_M_t).
                           super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                           .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,true);
    if (local_58._8_8_ != (DWARFDebugInfoEntry *)0x0 && local_58 != (DWARFUnit *)0x0) {
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,(DWARFDie *)local_58,DW_AT_stmt_list
                    );
      OVar4 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_90);
      CUDIE.Die = (DWARFDebugInfoEntry *)OVar4.Storage.field_0;
      if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           ((OptionalStorage<unsigned_long,_true> *)&CUDIE.Die);
        local_90[0].second =
             (puVar3->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
        local_90[0].first = *puVar2;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_long,llvm::DWARFUnit*>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
                    *)&local_c0,local_90);
      }
    }
  }
  for (; TUs.begin_iterator != TUs.end_iterator; TUs.begin_iterator = TUs.begin_iterator + 1) {
    _local_58 = DWARFUnit::getUnitDIE
                          (((TUs.begin_iterator)->_M_t).
                           super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                           .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,true);
    if (local_58._8_8_ != (DWARFDebugInfoEntry *)0x0 && local_58 != (DWARFUnit *)0x0) {
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,(DWARFDie *)local_58,DW_AT_stmt_list
                    );
      OVar4 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_90);
      CUDIE.Die = (DWARFDebugInfoEntry *)OVar4.Storage.field_0;
      if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           ((OptionalStorage<unsigned_long,_true> *)&CUDIE.Die);
        local_90[0].second =
             ((TUs.begin_iterator)->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
        local_90[0].first = *puVar2;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_long,llvm::DWARFUnit*>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFUnit*>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFUnit*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFUnit*>>>
                    *)&local_c0,local_90);
      }
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
               *)this,&local_c0);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFUnit_*>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::~_Rb_tree(&local_c0);
  if ((this->DebugLineData->super_DataExtractor).Data.Length <= this->Offset) {
    this->Done = true;
  }
  return;
}

Assistant:

DWARFDebugLine::SectionParser::SectionParser(DWARFDataExtractor &Data,
                                             const DWARFContext &C,
                                             cu_range CUs, tu_range TUs)
    : DebugLineData(Data), Context(C) {
  LineToUnit = buildLineToUnitMap(CUs, TUs);
  if (!DebugLineData.isValidOffset(Offset))
    Done = true;
}